

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O3

void __thiscall xlib::Log::Format<int>(Log *this,string *format,int *first)

{
  ulong uVar1;
  ostringstream oss;
  undefined1 *local_1b8;
  undefined1 local_1a8 [16];
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  uVar1 = std::__cxx11::string::find_first_of((char *)format,0x12548e,0);
  if (uVar1 != 0xffffffffffffffff) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::ostream::operator<<((ostream *)local_198,*first);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::replace((ulong)format,uVar1,(char *)0x2,(ulong)local_1b8);
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8);
    }
    std::__cxx11::ostringstream::~ostringstream(local_198);
    std::ios_base::~ios_base(local_128);
  }
  return;
}

Assistant:

void Format(std::string* format,  const First& first, const Rest&... rest) {
        size_t index = format->find_first_of("%v");
        if (index == std::string::npos) {
            return;
        }
        std::ostringstream oss;
        oss << first;
        format->replace(index, 2, oss.str());
        Format(format, rest...);
    }